

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_mvcp(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_28;
  TCGv_i64 local_20;
  TCGv_i64 local_18;
  TCGv_i64 local_10;
  
  if (((s->fields).presentO & 0x8000) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_20 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->regs[(s->fields).c[3]]);
    local_18 = o->addr1 + (long)tcg_ctx;
    local_10 = o->in2 + (long)tcg_ctx;
    tcg_gen_callN_s390x(tcg_ctx,helper_mvcp,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_28)
    ;
    set_cc_static(s);
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_mvcp(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, l1);
    gen_helper_mvcp(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, tcg_ctx->regs[r1], o->addr1, o->in2);
    set_cc_static(s);
    return DISAS_NEXT;
}